

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

bool test::SendPreconnectData(SDKConnection *connection)

{
  bool bVar1;
  void *__src;
  long lVar2;
  SDKResult result;
  string Hello;
  uint8_t hello [1401];
  LogStringBuffer buffer_1;
  LogStringBuffer buffer;
  LogStringBuffer buffer_2;
  char *in_stack_fffffffffffff138;
  LogStringBuffer *in_stack_fffffffffffff140;
  SDKConnection *in_stack_fffffffffffff148;
  SDKResult *in_stack_fffffffffffff168;
  LogStringBuffer *in_stack_fffffffffffff178;
  LogStringBuffer *pLVar3;
  OutputWorker *in_stack_fffffffffffff180;
  LogStringBuffer *pLVar4;
  LogStringBuffer *this;
  string local_de8 [32];
  TonkResult local_dc8;
  undefined4 local_dc4;
  string local_dc0 [32];
  TonkResult local_da0;
  allocator local_d89;
  string local_d88 [32];
  undefined1 local_d68;
  undefined1 local_d67 [1422];
  byte local_7d9;
  string *local_7d8;
  char *local_7d0;
  undefined8 *local_7c8;
  string *local_7c0;
  char *local_7b8;
  undefined8 *local_7b0;
  char *local_7a8;
  undefined8 *local_7a0;
  string *local_798;
  char *local_790;
  undefined4 local_784;
  undefined8 *local_780;
  undefined4 local_774;
  undefined8 *local_770;
  string *local_768;
  char *local_760;
  undefined4 local_754;
  undefined8 *local_750;
  undefined4 local_744;
  undefined8 *local_740;
  undefined1 local_728 [16];
  ostream aoStack_718 [376];
  string *local_5a0;
  char *local_598;
  undefined4 local_58c;
  undefined8 *local_588;
  undefined1 local_570 [16];
  ostream aoStack_560 [376];
  string *local_3e8;
  char *local_3e0;
  undefined4 local_3d4;
  undefined8 *local_3d0;
  string *local_3c8;
  char *local_3c0;
  undefined *local_3b8;
  undefined1 *local_3b0;
  undefined8 *local_3a8;
  undefined *local_3a0;
  undefined1 *local_398;
  undefined8 *local_390;
  undefined *local_388;
  undefined1 *local_380;
  string *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  LogStringBuffer *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  LogStringBuffer *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  string *local_328;
  char *local_320;
  undefined1 *local_318;
  LogStringBuffer *local_310;
  string *local_308;
  undefined1 *local_300;
  LogStringBuffer *local_2f8;
  string *local_2f0;
  undefined1 *local_2e8;
  string *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined8 *local_2c8;
  string *local_2c0;
  undefined1 *local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined8 *local_288;
  char *local_280;
  undefined1 *local_278;
  LogStringBuffer *local_270;
  char *local_268;
  undefined1 *local_260;
  char *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  undefined8 *local_238;
  undefined4 local_22c;
  undefined8 *local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  undefined8 *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  memset(&local_d68,0,0x579);
  local_d68 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d88,"Pre-connect message",&local_d89);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  __src = (void *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::length();
  memcpy(local_d67,__src,lVar2 + 1);
  FunctionTimer::BeginCall((FunctionTimer *)in_stack_fffffffffffff140);
  std::__cxx11::string::length();
  local_da0 = (TonkResult)
              tonk::SDKConnection::Send
                        (in_stack_fffffffffffff148,in_stack_fffffffffffff140,
                         (uint64_t)in_stack_fffffffffffff138,0);
  FunctionTimer::EndCall((FunctionTimer *)in_stack_fffffffffffff140);
  bVar1 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x11272e);
  if (bVar1) {
    FunctionTimer::BeginCall((FunctionTimer *)in_stack_fffffffffffff140);
    local_dc8 = (TonkResult)
                tonk::SDKConnection::Send
                          (in_stack_fffffffffffff148,in_stack_fffffffffffff140,
                           (uint64_t)in_stack_fffffffffffff138,0);
    local_da0 = local_dc8;
    FunctionTimer::EndCall((FunctionTimer *)in_stack_fffffffffffff140);
    bVar1 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x112be4);
    if (bVar1) {
      local_7a0 = &Logger;
      local_7a8 = "Sent preconnect data";
      local_238 = &Logger;
      local_23c = 1;
      local_248 = "Sent preconnect data";
      local_228 = &Logger;
      local_22c = 1;
      if (DAT_00129388 < 2) {
        local_78 = &Logger;
        local_7c = 1;
        local_88 = "Sent preconnect data";
        pLVar3 = (LogStringBuffer *)&Logger;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff140,in_stack_fffffffffffff138,Trace);
        in_stack_fffffffffffff140 = pLVar3;
        local_68 = &in_stack_fffffffffffff140->field_0x38;
        local_60 = local_210;
        local_70 = local_88;
        local_58 = in_stack_fffffffffffff140;
        local_50 = local_68;
        local_48 = local_60;
        local_40 = in_stack_fffffffffffff140;
        local_38 = local_68;
        local_30 = local_60;
        std::operator<<(aoStack_200,(string *)local_68);
        local_20 = local_60;
        local_28 = local_70;
        local_8 = local_60;
        local_10 = local_70;
        local_18 = in_stack_fffffffffffff140;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff180,in_stack_fffffffffffff178);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x11320e);
      }
      FunctionTimer::BeginCall((FunctionTimer *)in_stack_fffffffffffff140);
      tonk::SDKConnection::Flush((SDKConnection *)0x11322f);
      FunctionTimer::EndCall((FunctionTimer *)in_stack_fffffffffffff140);
      local_7d9 = 1;
    }
    else {
      tonk::SDKResult::ToString_abi_cxx11_(in_stack_fffffffffffff168);
      local_7c8 = &Logger;
      local_7d0 = "tonk_send 2 failed: ";
      local_7d8 = local_de8;
      local_750 = &Logger;
      local_754 = 4;
      local_760 = "tonk_send 2 failed: ";
      local_740 = &Logger;
      local_744 = 4;
      local_768 = local_7d8;
      if (DAT_00129388 < 5) {
        local_588 = &Logger;
        local_58c = 4;
        local_598 = "tonk_send 2 failed: ";
        pLVar4 = (LogStringBuffer *)&Logger;
        local_5a0 = local_7d8;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff140,in_stack_fffffffffffff138,Trace);
        local_368 = &pLVar4->field_0x38;
        local_360 = local_728;
        local_370 = local_598;
        local_378 = local_5a0;
        this = pLVar4;
        local_358 = pLVar4;
        local_350 = local_368;
        local_348 = local_360;
        local_340 = pLVar4;
        local_338 = local_368;
        local_330 = local_360;
        std::operator<<(aoStack_718,(string *)local_368);
        local_318 = local_360;
        local_320 = local_370;
        local_328 = local_378;
        local_278 = local_360;
        local_280 = local_370;
        local_260 = local_360;
        local_268 = local_370;
        pLVar3 = pLVar4;
        local_310 = pLVar4;
        local_270 = pLVar4;
        std::operator<<((ostream *)(local_360 + 0x10),local_370);
        local_300 = local_318;
        local_308 = local_328;
        local_2e8 = local_318;
        local_2f0 = local_328;
        local_2f8 = pLVar4;
        std::operator<<((ostream *)(local_318 + 0x10),local_328);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write((OutputWorker *)this,pLVar3);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x112f55);
      }
      std::__cxx11::string::~string(local_de8);
      local_7d9 = 0;
    }
  }
  else {
    tonk::SDKResult::ToString_abi_cxx11_(in_stack_fffffffffffff168);
    local_7b0 = &Logger;
    local_7b8 = "tonk_send 1 failed: ";
    local_7c0 = local_dc0;
    local_780 = &Logger;
    local_784 = 4;
    local_790 = "tonk_send 1 failed: ";
    local_770 = &Logger;
    local_774 = 4;
    local_798 = local_7c0;
    if (DAT_00129388 < 5) {
      local_3d0 = &Logger;
      local_3d4 = 4;
      local_3e0 = "tonk_send 1 failed: ";
      local_3e8 = local_7c0;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff140,in_stack_fffffffffffff138,Trace);
      local_3b8 = &DAT_001293b8;
      local_3a8 = &Logger;
      local_3b0 = local_570;
      local_3c0 = local_3e0;
      local_3c8 = local_3e8;
      local_390 = &Logger;
      local_3a0 = local_3b8;
      local_398 = local_3b0;
      local_388 = local_3b8;
      local_380 = local_3b0;
      std::operator<<(aoStack_560,(string *)&DAT_001293b8);
      local_2c8 = &Logger;
      local_2d0 = local_3b0;
      local_2d8 = local_3c0;
      local_2e0 = local_3c8;
      local_288 = &Logger;
      local_290 = local_3b0;
      local_298 = local_3c0;
      local_250 = local_3b0;
      local_258 = local_3c0;
      std::operator<<((ostream *)(local_3b0 + 0x10),local_3c0);
      local_2b0 = &Logger;
      local_2b8 = local_2d0;
      local_2c0 = local_2e0;
      local_2a0 = local_2d0;
      local_2a8 = local_2e0;
      std::operator<<((ostream *)(local_2d0 + 0x10),local_2e0);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_fffffffffffff180,in_stack_fffffffffffff178);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x112ac6);
    }
    std::__cxx11::string::~string(local_dc0);
    local_7d9 = 0;
  }
  local_dc4 = 1;
  std::__cxx11::string::~string(local_d88);
  return (bool)(local_7d9 & 1);
}

Assistant:

bool SendPreconnectData(tonk::SDKConnection* connection)
{
    uint8_t hello[1 + 1400] = {};
    hello[0] = ID_ConnectionRebroadcast;
    std::string Hello = "Pre-connect message";
    memcpy(hello + 1, Hello.c_str(), Hello.length() + 1);

    t_tonk_send.BeginCall();
    tonk::SDKResult result = connection->Send(hello, 1 + Hello.length() + 1, TonkChannel_Reliable0);
    t_tonk_send.EndCall();

    if (!result)
    {
        Logger.Error("tonk_send 1 failed: ", result.ToString());
        return false;
    }

    t_tonk_send.BeginCall();
    result = connection->Send(PreConnectData, kPreConnectDataBytes, kPreConnectChannel);
    t_tonk_send.EndCall();

    if (!result)
    {
        Logger.Error("tonk_send 2 failed: ", result.ToString());
        return false;
    }

    Logger.Debug("Sent preconnect data");

    t_tonk_flush.BeginCall();
    connection->Flush();
    t_tonk_flush.EndCall();

    return true;
}